

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O1

void __thiscall xmrig::CudaBackend::setJob(CudaBackend *this,Job *job)

{
  CudaLaunchData *pCVar1;
  CudaBackendPrivate *pCVar2;
  pointer pCVar3;
  bool bVar4;
  int iVar5;
  Config *this_00;
  CudaConfig *this_01;
  Miner *miner;
  CudaLaunchData *other;
  CudaLaunchData *this_02;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> local_48;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  this_01 = Config::cuda(this_00);
  if (this_01->m_enabled == true) {
    CudaBackendPrivate::init(this->d_ptr,(EVP_PKEY_CTX *)this_01);
  }
  iVar5 = (*(this->super_IBackend)._vptr_IBackend[2])(this);
  if ((char)iVar5 == '\0') {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    return;
  }
  miner = Controller::miner(this->d_ptr->controller);
  CudaConfig::get(&local_48,this_01,miner,&this->d_ptr->devices);
  other = local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
          ._M_impl.super__Vector_impl_data._M_start;
  this_02 = (this->d_ptr->threads).
            super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->d_ptr->threads).
           super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (((this_02 != pCVar1) &&
      ((long)pCVar1 - (long)this_02 ==
       (long)local_48.
             super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_48.
             super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
             _M_impl.super__Vector_impl_data._M_start)) &&
     (bVar4 = CudaLaunchData::isEqual
                        (this_02,local_48.
                                 super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
                                 ._M_impl.super__Vector_impl_data._M_start), bVar4)) {
    do {
      this_02 = this_02 + 1;
      other = other + 1;
      if (this_02 == pCVar1) goto LAB_0016b488;
      bVar4 = CudaLaunchData::isEqual(this_02,other);
    } while (bVar4);
  }
  if (local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Log::print(WARNING,
               "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m",
               "\x1b[42;1m\x1b[1;37m nv  \x1b[0m");
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
  }
  else {
    (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
    pCVar2 = this->d_ptr;
    pCVar3 = (pCVar2->threads).
             super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (pCVar2->threads).
    super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pCVar2->threads).
    super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pCVar2->threads).
    super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pCVar3 != (pointer)0x0) {
      operator_delete(pCVar3);
    }
    CudaBackendPrivate::start(this->d_ptr,job);
  }
LAB_0016b488:
  if (local_48.super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void xmrig::CudaBackend::setJob(const Job &job)
{
    const auto &cuda = d_ptr->controller->config()->cuda();
    if (cuda.isEnabled()) {
        d_ptr->init(cuda);
    }

    if (!isEnabled()) {
        return stop();
    }

    auto threads = cuda.get(d_ptr->controller->miner(), d_ptr->devices);
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start(job);
}